

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt,xmlNodeSetPtr val)

{
  void *pvVar1;
  xmlXPathContextCachePtr cache;
  xmlXPathObjectPtr pxVar2;
  
  if (((pctxt->context == (xmlXPathContextPtr)0x0) ||
      (pvVar1 = pctxt->context->cache, pvVar1 == (void *)0x0)) ||
     (pxVar2 = *(xmlXPathObjectPtr *)((long)pvVar1 + 8), pxVar2 == (xmlXPathObjectPtr)0x0)) {
    pxVar2 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (pxVar2 == (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeNodeSet(val);
      pxVar2 = (xmlXPathObjectPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar2 = 0;
      pxVar2->nodesetval = (xmlNodeSetPtr)0x0;
      *(undefined8 *)&pxVar2->index = 0;
      pxVar2->user2 = (void *)0x0;
      pxVar2->stringval = (xmlChar *)0x0;
      pxVar2->user = (void *)0x0;
      *(undefined8 *)&pxVar2->boolval = 0;
      pxVar2->floatval = 0.0;
      *(undefined8 *)&pxVar2->index2 = 0;
      pxVar2->type = XPATH_NODESET;
      pxVar2->nodesetval = val;
    }
    if (pxVar2 == (xmlXPathObjectPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    *(xmlChar **)((long)pvVar1 + 8) = pxVar2->stringval;
    *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + -1;
    pxVar2->stringval = (xmlChar *)0x0;
    pxVar2->type = XPATH_NODESET;
    pxVar2->nodesetval = val;
  }
  return pxVar2;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt, xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
	    return(ret);
	}
    }

    ret = xmlXPathWrapNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}